

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O3

uint32_t FAPOBase_LockForProcess
                   (FAPOBase *fapo,uint32_t InputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pInputLockedParameters,
                   uint32_t OutputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pOutputLockedParameters)

{
  uint uVar1;
  FAPORegistrationProperties *pFVar2;
  
  pFVar2 = fapo->m_pRegistrationProperties;
  if ((((((pFVar2->MinInputBufferCount <= InputLockedParameterCount) &&
         (InputLockedParameterCount <= pFVar2->MaxInputBufferCount)) &&
        (pFVar2->MinOutputBufferCount <= OutputLockedParameterCount)) &&
       (OutputLockedParameterCount <= pFVar2->MaxOutputBufferCount)) &&
      (((uVar1 = pFVar2->Flags, (uVar1 & 1) == 0 ||
        (pInputLockedParameters->pFormat->nChannels == pOutputLockedParameters->pFormat->nChannels))
       && (((uVar1 & 2) == 0 ||
           (pInputLockedParameters->pFormat->nSamplesPerSec ==
            pOutputLockedParameters->pFormat->nSamplesPerSec)))))) &&
     ((((uVar1 & 4) == 0 ||
       (pInputLockedParameters->pFormat->wBitsPerSample ==
        pOutputLockedParameters->pFormat->wBitsPerSample)) &&
      ((InputLockedParameterCount == OutputLockedParameterCount || ((uVar1 & 8) == 0)))))) {
    fapo->m_fIsLocked = '\x01';
    return 0;
  }
  return 0x80070057;
}

Assistant:

uint32_t FAPOBase_LockForProcess(
	FAPOBase *fapo,
	uint32_t InputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pInputLockedParameters,
	uint32_t OutputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pOutputLockedParameters
) {
	/* Verify parameter counts... */
	if (	InputLockedParameterCount < fapo->m_pRegistrationProperties->MinInputBufferCount ||
		InputLockedParameterCount > fapo->m_pRegistrationProperties->MaxInputBufferCount ||
		OutputLockedParameterCount < fapo->m_pRegistrationProperties->MinOutputBufferCount ||
		OutputLockedParameterCount > fapo->m_pRegistrationProperties->MaxOutputBufferCount	)
	{
		return FAUDIO_E_INVALID_ARG;
	}


	/* Validate input/output formats */
	#define VERIFY_FORMAT_FLAG(flag, prop) \
		if (	(fapo->m_pRegistrationProperties->Flags & flag) && \
			(pInputLockedParameters->pFormat->prop != pOutputLockedParameters->pFormat->prop)	) \
		{ \
			return FAUDIO_E_INVALID_ARG; \
		}
	VERIFY_FORMAT_FLAG(FAPO_FLAG_CHANNELS_MUST_MATCH, nChannels)
	VERIFY_FORMAT_FLAG(FAPO_FLAG_FRAMERATE_MUST_MATCH, nSamplesPerSec)
	VERIFY_FORMAT_FLAG(FAPO_FLAG_BITSPERSAMPLE_MUST_MATCH, wBitsPerSample)
	#undef VERIFY_FORMAT_FLAG
	if (	(fapo->m_pRegistrationProperties->Flags & FAPO_FLAG_BUFFERCOUNT_MUST_MATCH) &&
		(InputLockedParameterCount != OutputLockedParameterCount)	)
	{
		return FAUDIO_E_INVALID_ARG;
	}
	fapo->m_fIsLocked = 1;
	return 0;
}